

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall GameLoop::~GameLoop(GameLoop *this)

{
  vector<Player_*,_std::allocator<Player_*>_> *pvVar1;
  pointer ppPVar2;
  Deck *this_00;
  
  pvVar1 = this->allPlayers;
  if ((pvVar1 != (vector<Player_*,_std::allocator<Player_*>_> *)0x0) &&
     (ppPVar2 = (pvVar1->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_start, ppPVar2 != (pointer)0x0)) {
    operator_delete(ppPVar2,(long)(pvVar1->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar2)
    ;
  }
  operator_delete(pvVar1,0x18);
  this->gameMap = (Map *)0x0;
  this_00 = this->gameDeck;
  if (this_00 != (Deck *)0x0) {
    Deck::~Deck(this_00);
  }
  operator_delete(this_00,0x18);
  return;
}

Assistant:

GameLoop::~GameLoop() {
    delete allPlayers;
    // In tournament mode, the maps are stored in a vector (heap memory) so we cant delete them if we reuse the map
    this->gameMap = nullptr;
    delete this->gameDeck;
}